

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_WriteAfterWrongVersionOnEarlyData_Test::TestBody
          (SSLTest_WriteAfterWrongVersionOnEarlyData_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  SSL_METHOD *method;
  char *pcVar3;
  pointer psVar4;
  pointer session_00;
  SSL *pSVar5;
  SSL_SESSION *session_01;
  pointer psVar6;
  BIO_METHOD *type;
  BIO *__p;
  pointer pbVar7;
  ulong uVar8;
  char *in_R9;
  AssertHelper local_5d0;
  Message local_5c8;
  uint local_5bc;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_588;
  Message local_580;
  int local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_540;
  Message local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__11;
  Message local_518;
  int local_510 [2];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_8;
  Message local_4f0;
  int local_4e8 [2];
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_4b0;
  Message local_4a8;
  int local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__10;
  Message local_480;
  uint local_474;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_440;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__9;
  size_t len;
  uint8_t *unused;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__8;
  Message local_3c0;
  int local_3b8 [2];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_5;
  Message local_398;
  int local_390 [2];
  undefined1 local_388 [8];
  AssertionResult gtest_ar_4;
  string local_370;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<BIO> mem;
  Message local_320;
  int local_318 [2];
  undefined1 local_310 [8];
  AssertionResult gtest_ar_3;
  Message local_2f8;
  int local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  Message local_2d0;
  int local_2c8 [2];
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__6;
  Message local_260;
  int local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_c0;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_70;
  AssertHelper local_50;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_20;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  SSLTest_WriteAfterWrongVersionOnEarlyData_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&server_ctx,psVar2);
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&local_20,method);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_40,&server_ctx,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_40,(AssertionResult *)"client_ctx","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xcc6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_48);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,&local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&session,(internal *)local_88,(AssertionResult *)"server_ctx","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xcc7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&session);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&server_ctx);
      SSL_CTX_set_early_data_enabled(psVar2,1);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
      SSL_CTX_set_early_data_enabled(psVar2,1);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&server_ctx);
      SSL_CTX_set_session_cache_mode(psVar2,3);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
      SSL_CTX_set_session_cache_mode(psVar2,3);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&server_ctx);
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__2.message_);
      CreateClientSession((anon_unknown_0 *)&local_c0,psVar2,psVar4,
                          (ClientConfig *)&gtest_ar__2.message_);
      ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__2.message_);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_128,&local_c0,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,(AssertionResult *)0x4f1864
                   ,"false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xcd0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_130);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        session_00 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_c0);
        local_16c = SSL_SESSION_early_data_capable(session_00);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_168,&local_16c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&client,(internal *)local_168,
                     (AssertionResult *)"SSL_SESSION_early_data_capable(session.get())","false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xcd1,pcVar3);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          std::__cxx11::string::~string((string *)&client);
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
        std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
        std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__4.message_);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&server_ctx);
        psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
        local_1c1 = CreateClientAndServer
                              (&server,(UniquePtr<SSL> *)&gtest_ar__4.message_,psVar2,psVar4);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_1c0,
                     (AssertionResult *)
                     "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xcd6,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_1d0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          session_01 = (SSL_SESSION *)
                       std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_c0);
          SSL_set_session(pSVar5,session_01);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          local_20c = SSL_set_max_proto_version(psVar6,0x303);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_208,&local_20c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar1) {
            testing::Message::Message(&local_218);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_208,
                       (AssertionResult *)"SSL_set_max_proto_version(server.get(), 0x0303)","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_220,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xcd8,pcVar3);
            testing::internal::AssertHelper::operator=(&local_220,&local_218);
            testing::internal::AssertHelper::~AssertHelper(&local_220);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_218);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
          local_258[1] = 1;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_258[0] = SSL_do_handshake(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_250,"1","SSL_do_handshake(client.get())",local_258 + 1,
                     local_258);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
          if (!bVar1) {
            testing::Message::Message(&local_260);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xcdb,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__6.message_,&local_260);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_260);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_27c = SSL_in_early_data(psVar6);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_278,&local_27c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_288);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_278,
                       (AssertionResult *)"SSL_in_early_data(client.get())","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xcdc,pcVar3);
            testing::internal::AssertHelper::operator=(&local_290,&local_288);
            testing::internal::AssertHelper::~AssertHelper(&local_290);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_288);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          local_2c8[1] = 0xffffffff;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
          local_2c8[0] = SSL_do_handshake(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2c0,"-1","SSL_do_handshake(server.get())",local_2c8 + 1,
                     local_2c8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xcdf,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
          local_2f0[1] = 2;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
          local_2f0[0] = SSL_get_error(pSVar5,-1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2e8,"2","SSL_get_error(server.get(), -1)",local_2f0 + 1,
                     local_2f0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
          if (!bVar1) {
            testing::Message::Message(&local_2f8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xce0,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_2f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_2f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
          local_318[1] = 0x303;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
          local_318[0] = SSL_version(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_310,"0x0303","SSL_version(server.get())",local_318 + 1,
                     local_318);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
          if (!bVar1) {
            testing::Message::Message(&local_320);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&mem,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xce1,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&mem,&local_320);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem);
            testing::Message::~Message(&local_320);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
          type = BIO_s_mem();
          __p = BIO_new(type);
          std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                     (pointer)__p);
          testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_340,
                     (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
          if (!bVar1) {
            testing::Message::Message(&local_348);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_370,(internal *)local_340,(AssertionResult *)"mem","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_350,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xce5,pcVar3);
            testing::internal::AssertHelper::operator=(&local_350,&local_348);
            testing::internal::AssertHelper::~AssertHelper(&local_350);
            std::__cxx11::string::~string((string *)&local_370);
            testing::Message::~Message(&local_348);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
            UpRef((bssl *)&gtest_ar_4.message_,(UniquePtr<BIO> *)&gtest_ar__7.message_);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_4.message_)
            ;
            SSL_set0_wbio(psVar6,pbVar7);
            std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_4.message_);
            local_390[1] = 0xffffffff;
            pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
            local_390[0] = SSL_do_handshake(pSVar5);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_388,"-1","SSL_do_handshake(client.get())",local_390 + 1,
                       local_390);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
            if (!bVar1) {
              testing::Message::Message(&local_398);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xce9,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_398);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_398);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
            local_3b8[1] = 1;
            pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
            local_3b8[0] = SSL_get_error(pSVar5,-1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_3b0,"1","SSL_get_error(client.get(), -1)",local_3b8 + 1,
                       local_3b8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
            if (!bVar1) {
              testing::Message::Message(&local_3c0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcea,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__8.message_,&local_3c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_3c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
            uVar8 = ERR_get_error();
            ErrorEquals((uint32_t)local_3d8,(int)uVar8,0x10);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
            if (!bVar1) {
              testing::Message::Message(&local_3e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&unused,(internal *)local_3d8,
                         (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_SSL, 278)","false"
                         ,"true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3e8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcec,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
              testing::internal::AssertHelper::~AssertHelper(&local_3e8);
              std::__cxx11::string::~string((string *)&unused);
              testing::Message::~Message(&local_3e0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
            pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_
                               );
            local_42c = BIO_mem_contents(pbVar7,(uint8_t **)&len,(size_t *)&gtest_ar__9.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_428,&local_42c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
            if (!bVar1) {
              testing::Message::Message(&local_438);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_6.message_,(internal *)local_428,
                         (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_440,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcf1,pcVar3);
              testing::internal::AssertHelper::operator=(&local_440,&local_438);
              testing::internal::AssertHelper::~AssertHelper(&local_440);
              std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_438);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_474 = 0;
              testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                        ((internal *)local_470,"0u","len",&local_474,
                         (unsigned_long *)&gtest_ar__9.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
              if (!bVar1) {
                testing::Message::Message(&local_480);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcf2,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__10.message_,&local_480);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_480);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
              pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__7.message_);
              local_49c = BIO_reset(pbVar7);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_498,&local_49c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
              if (!bVar1) {
                testing::Message::Message(&local_4a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_7.message_,(internal *)local_498,
                           (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcf3,pcVar3);
                testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
                testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                testing::Message::~Message(&local_4a8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
              local_4e8[1] = 0xffffffff;
              pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
              local_4e8[0] = SSL_write(pSVar5,"a",1);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_4e0,"-1","SSL_write(client.get(), \"a\", 1)",
                         local_4e8 + 1,local_4e8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
              if (!bVar1) {
                testing::Message::Message(&local_4f0);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcf6,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_8.message_,&local_4f0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_)
                ;
                testing::Message::~Message(&local_4f0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
              local_510[1] = 1;
              pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
              local_510[0] = SSL_get_error(pSVar5,-1);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_508,"1","SSL_get_error(client.get(), -1)",local_510 + 1,
                         local_510);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
              if (!bVar1) {
                testing::Message::Message(&local_518);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcf7,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__11.message_,&local_518);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__11.message_);
                testing::Message::~Message(&local_518);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
              uVar8 = ERR_get_error();
              ErrorEquals((uint32_t)local_530,(int)uVar8,0x10);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
              if (!bVar1) {
                testing::Message::Message(&local_538);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__12.message_,(internal *)local_530,
                           (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_SSL, 278)",
                           "false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_540,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcf9,pcVar3);
                testing::internal::AssertHelper::operator=(&local_540,&local_538);
                testing::internal::AssertHelper::~AssertHelper(&local_540);
                std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                testing::Message::~Message(&local_538);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
              pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__7.message_);
              local_574 = BIO_mem_contents(pbVar7,(uint8_t **)&len,(size_t *)&gtest_ar__9.message_);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_570,&local_574,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
              if (!bVar1) {
                testing::Message::Message(&local_580);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_9.message_,(internal *)local_570,
                           (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                           "true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_588,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcfc,pcVar3);
                testing::internal::AssertHelper::operator=(&local_588,&local_580);
                testing::internal::AssertHelper::~AssertHelper(&local_588);
                std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
                testing::Message::~Message(&local_580);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_5bc = 0;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_5b8,"0u","len",&local_5bc,
                           (unsigned_long *)&gtest_ar__9.message_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5b8);
                if (!bVar1) {
                  testing::Message::Message(&local_5c8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_5d0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xcfd,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
                  testing::internal::AssertHelper::~AssertHelper(&local_5d0);
                  testing::Message::~Message(&local_5c8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = 0;
              }
            }
          }
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
        }
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_c0);
    }
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
  return;
}

Assistant:

TEST(SSLTest, WriteAfterWrongVersionOnEarlyData) {
  // Set up some 0-RTT-enabled contexts.
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(client_ctx);
  ASSERT_TRUE(server_ctx);
  SSL_CTX_set_early_data_enabled(client_ctx.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx.get(), 1);
  SSL_CTX_set_session_cache_mode(client_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx.get(), SSL_SESS_CACHE_BOTH);

  // Get an early-data-capable session.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx.get(), server_ctx.get());
  ASSERT_TRUE(session);
  EXPECT_TRUE(SSL_SESSION_early_data_capable(session.get()));

  // Offer the session to the server, but now the server speaks TLS 1.2.
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  SSL_set_session(client.get(), session.get());
  EXPECT_TRUE(SSL_set_max_proto_version(server.get(), TLS1_2_VERSION));

  // The client handshake initially succeeds in the early data state.
  EXPECT_EQ(1, SSL_do_handshake(client.get()));
  EXPECT_TRUE(SSL_in_early_data(client.get()));

  // The server processes the ClientHello and negotiates TLS 1.2.
  EXPECT_EQ(-1, SSL_do_handshake(server.get()));
  EXPECT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(server.get(), -1));
  EXPECT_EQ(TLS1_2_VERSION, SSL_version(server.get()));

  // Capture the client's output.
  bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(mem);
  SSL_set0_wbio(client.get(), bssl::UpRef(mem).release());

  // The client processes the ServerHello and fails.
  EXPECT_EQ(-1, SSL_do_handshake(client.get()));
  EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(client.get(), -1));
  EXPECT_TRUE(ErrorEquals(ERR_get_error(), ERR_LIB_SSL,
                          SSL_R_WRONG_VERSION_ON_EARLY_DATA));

  // The client should have written an alert to the transport.
  const uint8_t *unused;
  size_t len;
  ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
  EXPECT_NE(0u, len);
  EXPECT_TRUE(BIO_reset(mem.get()));

  // Writing should fail, with the same error as the handshake.
  EXPECT_EQ(-1, SSL_write(client.get(), "a", 1));
  EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(client.get(), -1));
  EXPECT_TRUE(ErrorEquals(ERR_get_error(), ERR_LIB_SSL,
                          SSL_R_WRONG_VERSION_ON_EARLY_DATA));

  // Nothing should be written to the transport.
  ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
  EXPECT_EQ(0u, len);
}